

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O1

bool duckdb::ValuePositionComparator::Final<duckdb::GreaterThanEquals>(Value *lhs,Value *rhs)

{
  bool bVar1;
  
  if (((rhs->is_null != true) || (bVar1 = true, lhs->is_null == false)) &&
     (bVar1 = lhs->is_null, rhs->is_null == false && bVar1 == false)) {
    bVar1 = TemplatedBooleanOperation<duckdb::GreaterThan>(rhs,lhs);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool ValuePositionComparator::Final<duckdb::GreaterThanEquals>(const Value &lhs, const Value &rhs) {
	return !ValuePositionComparator::Final<duckdb::GreaterThan>(rhs, lhs);
}